

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocket.hpp
# Opt level: O0

void __thiscall
webfront::websocket::Frame<webfront::networking::TCPNetworkingTS>::Frame
          (Frame<webfront::networking::TCPNetworkingTS> *this,string_view text)

{
  byte **__args;
  vector<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
  *this_00;
  unsigned_long *__args_1;
  long in_RDI;
  Header *in_stack_ffffffffffffff88;
  basic_string_view<char,_std::char_traits<char>_> *this_01;
  unsigned_long *in_stack_ffffffffffffff90;
  Header *in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffc0;
  Header *in_stack_ffffffffffffffc8;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  Header::Header((Header *)0x13bfe2);
  http::std::
  vector<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
  ::vector((vector<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
            *)0x13bff5);
  Header::setFIN(in_stack_ffffffffffffff98,SUB81((ulong)in_stack_ffffffffffffff90 >> 0x38,0));
  Header::setOpcode(in_stack_ffffffffffffff98,(Opcode)((ulong)in_stack_ffffffffffffff90 >> 0x20));
  http::std::basic_string_view<char,_std::char_traits<char>_>::size(&local_10);
  Header::setPayloadSize(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  __args = (byte **)(in_RDI + 0x10);
  http::std::array<std::byte,_14UL>::data((array<std::byte,_14UL> *)0x13c046);
  this_00 = (vector<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
             *)Header::headerSize(in_stack_ffffffffffffff88);
  std::
  vector<std::experimental::net::v1::const_buffer,std::allocator<std::experimental::net::v1::const_buffer>>
  ::emplace_back<std::byte*,unsigned_long>(this_00,__args,in_stack_ffffffffffffff90);
  __args_1 = (unsigned_long *)(in_RDI + 0x10);
  this_01 = &local_10;
  http::std::basic_string_view<char,_std::char_traits<char>_>::data(this_01);
  http::std::basic_string_view<char,_std::char_traits<char>_>::size(this_01);
  std::
  vector<std::experimental::net::v1::const_buffer,std::allocator<std::experimental::net::v1::const_buffer>>
  ::emplace_back<std::byte_const*,unsigned_long>(this_00,__args,__args_1);
  return;
}

Assistant:

Frame(std::string_view text) {
        setFIN(true);
        setOpcode(Opcode::text);
        setPayloadSize(text.size());
        buffers.emplace_back(raw.data(), headerSize());
        buffers.emplace_back(reinterpret_cast<const std::byte*>(text.data()), text.size());
    }